

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O2

int ngram_search_step(ps_search_t *search,int frame_idx)

{
  ps_config_t **pppVar1;
  uint16 uVar2;
  short sVar3;
  short sVar4;
  s3ssid_t sVar5;
  uint uVar6;
  ps_latnode_t *ppVar7;
  bitvec_t *pbVar8;
  dictword_t *pdVar9;
  char *pcVar10;
  ps_latnode_s *ppVar11;
  long lVar12;
  bin_mdef_t *pbVar13;
  ps_latlink_t *ppVar14;
  byte bVar15;
  _func_int_ps_search_t_ptr **pp_Var16;
  int iVar17;
  int32 iVar18;
  int iVar19;
  int32 iVar20;
  dict_t *pdVar21;
  int32 *piVar22;
  uint *puVar23;
  int16 *piVar24;
  int32 *piVar25;
  ps_lattice_t *ppVar26;
  uint uVar27;
  int iVar28;
  long *plVar29;
  dict2pid_t *pdVar30;
  acmod_t *paVar31;
  ps_searchfuncs_t *ppVar32;
  ps_search_t *ppVar33;
  uint uVar34;
  ulong uVar35;
  long lVar36;
  int iVar37;
  undefined8 *puVar38;
  bptbl_t *pbVar39;
  int iVar40;
  ngram_search_t *ngs;
  ps_latnode_s **pppVar41;
  acmod_t *paVar42;
  uint *puVar43;
  ngram_search_t *pnVar44;
  int iVar45;
  int iVar46;
  chan_s *pcVar47;
  chan_t *pcVar48;
  int *piVar49;
  xwdssid_t *pxVar50;
  hash_table_t **pphVar51;
  hmm_t *phVar52;
  hmm_t *phVar53;
  long lVar54;
  int iVar55;
  long lVar56;
  ulong uVar57;
  hmm_t *hmm;
  bool bVar58;
  ps_searchfuncs_t *ppStack_490;
  uint *puStack_480;
  undefined8 *puStack_478;
  uint uStack_46c;
  ulong uStack_468;
  ps_search_t *ppStack_460;
  ps_searchfuncs_t *ppStack_458;
  ulong uStack_450;
  uint *puStack_448;
  ulong uStack_440;
  int32 aiStack_438 [230];
  code *pcStack_a0;
  ngram_search_t *pnStack_98;
  uint uStack_8c;
  dict_t *pdStack_88;
  int iStack_80;
  float32 fStack_7c;
  ulong uStack_78;
  int iStack_70;
  int iStack_6c;
  int *piStack_68;
  ulong uStack_60;
  ulong uStack_58;
  dict2pid_t *pdStack_50;
  ulong uStack_48;
  int32 *piStack_40;
  int32 iStack_34;
  
  if (*(char *)&search[1].name == '\0') {
    if (*(char *)((long)&search[1].name + 1) == '\0') {
      return -1;
    }
    paVar42 = search->acmod;
    pnStack_98 = (ngram_search_t *)search;
    uStack_8c = frame_idx;
    if (paVar42->compallsen == '\0') {
      pcStack_a0 = (code *)0x137f5b;
      acmod_clear_active(paVar42);
      piVar49 = pnStack_98->active_word_list[frame_idx & 1U];
      iVar46 = 0;
      search = &pnStack_98->base;
      iVar17 = pnStack_98->n_active_word[frame_idx & 1U];
      if (pnStack_98->n_active_word[frame_idx & 1U] < 1) {
        iVar17 = iVar46;
      }
      for (; iVar46 != iVar17; iVar46 = iVar46 + 1) {
        iVar37 = *piVar49;
        piVar49 = piVar49 + 1;
        pcVar48 = ((ngram_search_t *)search)->word_chan[iVar37];
        do {
          if ((pcVar48->hmm).frame == frame_idx) {
            pcStack_a0 = (code *)0x137fb3;
            acmod_activate_hmm((((ngram_search_t *)search)->base).acmod,&pcVar48->hmm);
            search = &pnStack_98->base;
          }
          pcVar48 = pcVar48->next;
        } while (pcVar48 != (chan_s *)0x0);
      }
      paVar42 = (((ngram_search_t *)search)->base).acmod;
    }
    pcStack_a0 = (code *)0x137fd2;
    pdVar21 = (dict_t *)acmod_score(paVar42,(int *)&uStack_8c);
    piVar25 = &(((ngram_search_t *)search)->st).n_senone_active_utt;
    *piVar25 = *piVar25 + ((((ngram_search_t *)search)->base).acmod)->n_senone_active;
    pcStack_a0 = (code *)0x137fed;
    ngram_search_mark_bptable((ngram_search_t *)search,uStack_8c);
    iVar17 = 0;
    if (-0x20000000 < ((ngram_search_t *)search)->best_score) {
      if (((ngram_search_t *)search)->best_score + ((ngram_search_t *)search)->beam * 2 <
          -0x20000000) {
        iVar46 = 0;
        pcStack_a0 = (code *)0x138044;
        pdStack_88 = pdVar21;
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                ,0x345,"Renormalizing Scores at frame %d, best score %d\n",(ulong)uStack_8c);
        uVar27 = uStack_8c;
        iVar18 = ((ngram_search_t *)search)->best_score;
        piVar49 = ((ngram_search_t *)search)->active_word_list[uStack_8c & 1];
        iVar17 = ((ngram_search_t *)search)->n_active_word[uStack_8c & 1];
        if (((ngram_search_t *)search)->n_active_word[uStack_8c & 1] < 1) {
          iVar17 = 0;
        }
        for (; iVar46 != iVar17; iVar46 = iVar46 + 1) {
          iVar37 = *piVar49;
          piVar49 = piVar49 + 1;
          pcVar48 = ((ngram_search_t *)search)->word_chan[iVar37];
          do {
            if ((pcVar48->hmm).frame == uVar27) {
              pcStack_a0 = (code *)0x1380a5;
              hmm_normalize(&pcVar48->hmm,iVar18);
              search = &pnStack_98->base;
            }
            pcVar48 = pcVar48->next;
          } while (pcVar48 != (chan_s *)0x0);
        }
        ((ngram_search_t *)search)->renormalized = 1;
        pdVar21 = pdStack_88;
      }
      uVar27 = uStack_8c;
      ((ngram_search_t *)search)->best_score = -0x20000000;
      ((ngram_search_t *)search)->hmmctx->senscore = (int16 *)pdVar21;
      iVar17 = ((ngram_search_t *)search)->n_active_word[uStack_8c & 1];
      piVar49 = ((ngram_search_t *)search)->active_word_list[uStack_8c & 1];
      piVar25 = &(((ngram_search_t *)search)->st).n_fwdflat_words;
      *piVar25 = *piVar25 + iVar17;
      iVar46 = 0;
      if (iVar17 < 1) {
        iVar17 = iVar46;
      }
      iVar37 = -0x20000000;
      pdStack_88._0_4_ = iVar17;
LAB_00138109:
      uVar34 = uStack_8c;
      if (iVar46 != (int)pdStack_88) {
        iVar17 = *piVar49;
        piVar49 = piVar49 + 1;
        pcVar48 = ((ngram_search_t *)search)->word_chan[iVar17];
        if ((pcVar48->hmm).frame != uVar27) goto LAB_0013814c;
        pcStack_a0 = (code *)0x138130;
        iVar18 = hmm_vit_eval(&pcVar48->hmm);
        if ((iVar37 < iVar18) && (iVar17 != (pnStack_98->base).finish_wid)) {
          iVar37 = iVar18;
        }
        do {
          piVar25 = &(pnStack_98->st).n_fwdflat_chan;
          *piVar25 = *piVar25 + 1;
          search = &pnStack_98->base;
LAB_0013814c:
          do {
            pcVar48 = pcVar48->next;
            if (pcVar48 == (chan_s *)0x0) {
              iVar46 = iVar46 + 1;
              goto LAB_00138109;
            }
          } while ((pcVar48->hmm).frame != uVar27);
          pcStack_a0 = (code *)0x138163;
          iVar18 = hmm_vit_eval(&pcVar48->hmm);
          if (iVar37 < iVar18) {
            iVar37 = iVar18;
          }
        } while( true );
      }
      ((ngram_search_t *)search)->best_score = iVar37;
      iVar17 = uStack_8c + 1;
      iVar46 = ((ngram_search_t *)search)->n_active_word[uStack_8c & 1];
      piStack_68 = ((ngram_search_t *)search)->active_word_list[uStack_8c & 1];
      iVar37 = 0;
      pcStack_a0 = (code *)0x1381c5;
      memset(((ngram_search_t *)search)->word_active,0,
             (long)(((((ngram_search_t *)search)->base).n_words + 0x1f) / 0x20) << 2);
      fStack_7c = (float32)pnStack_98->pip;
      pdStack_88 = (dict_t *)
                   CONCAT44(pdStack_88._4_4_,pnStack_98->fwdflatbeam + pnStack_98->best_score);
      iStack_80 = pnStack_98->best_score + pnStack_98->fwdflatwbeam;
      if (iVar46 < 1) {
        iVar46 = 0;
      }
      pdStack_50 = (dict2pid_t *)CONCAT44(pdStack_50._4_4_,iVar46);
      while (uVar27 = uStack_8c, iVar37 != (int)pdStack_50) {
        uStack_48 = CONCAT44(uStack_48._4_4_,iVar37);
        iVar46 = *piStack_68;
        uStack_78 = (ulong)iVar46;
        pcVar48 = pnStack_98->word_chan[uStack_78];
        if (((pcVar48->hmm).frame == uVar34) && ((int)pdStack_88 < (pcVar48->hmm).bestscore)) {
          (pcVar48->hmm).frame = iVar17;
          pnStack_98->word_active[iVar46 / 0x20] =
               pnStack_98->word_active[iVar46 / 0x20] | 1 << ((byte)iVar46 & 0x1f);
          iVar37 = (pcVar48->hmm).out_score;
          pcVar47 = pcVar48->next;
          iVar45 = ((pnStack_98->base).dict)->word[uStack_78].pronlen;
          if (pcVar47 == (chan_s *)0x0) {
            if (iVar45 != 1) {
              pcStack_a0 = ngram_fwdflat_finish;
              __assert_fail("dict_is_single_phone(ps_search_dict(ngs), w)",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                            ,0x21c,"void fwdflat_prune_chan(ngram_search_t *, int)");
            }
            if (iStack_80 < iVar37) {
              pcStack_a0 = (code *)0x1382ec;
              ngram_search_save_bp(pnStack_98,uVar34,iVar46,iVar37,(pcVar48->hmm).out_history,0);
            }
          }
          else {
            if (iVar45 == 1) {
              pcStack_a0 = (code *)0x138a00;
              __assert_fail("!dict_is_single_phone(ps_search_dict(ngs), w)",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                            ,0x202,"void fwdflat_prune_chan(ngram_search_t *, int)");
            }
            iVar37 = iVar37 + (int)fStack_7c;
            if ((int)pdStack_88 < iVar37) {
              if ((pcVar47->info).penult_phn_wid < 0) {
                if (((pcVar47->hmm).frame < (int)uVar34) || ((pcVar47->hmm).score[0] < iVar37)) {
                  pcStack_a0 = (code *)0x13830d;
                  hmm_enter(&pcVar47->hmm,iVar37,(pcVar48->hmm).out_history,iVar17);
                }
              }
              else {
                for (; pcVar47 != (chan_s *)0x0; pcVar47 = pcVar47->next) {
                  if (((pcVar47->hmm).frame < (int)uVar34) || ((pcVar47->hmm).score[0] < iVar37)) {
                    pcStack_a0 = (code *)0x1382bd;
                    hmm_enter(&pcVar47->hmm,iVar37,(pcVar48->hmm).out_history,iVar17);
                  }
                }
              }
            }
          }
        }
        piStack_68 = piStack_68 + 1;
        bVar15 = (byte)uStack_78;
        piStack_40 = (int32 *)(long)(int)((long)((ulong)(uint)((int)uStack_78 >> 0x1f) << 0x20 |
                                                uStack_78 & 0xffffffff) / 0x20);
        while (pcVar48 = pcVar48->next, pcVar48 != (chan_s *)0x0) {
          iVar46 = (pcVar48->hmm).frame;
          if ((int)uVar34 <= iVar46) {
            if ((int)pdStack_88 < (pcVar48->hmm).bestscore) {
              (pcVar48->hmm).frame = iVar17;
              pnStack_98->word_active[(long)piStack_40] =
                   pnStack_98->word_active[(long)piStack_40] | 1 << (bVar15 & 0x1f);
              iVar46 = (pcVar48->hmm).out_score;
              if ((pcVar48->info).penult_phn_wid < 0) {
                iVar46 = iVar46 + (int)fStack_7c;
                if ((int)pdStack_88 < iVar46) {
                  pcVar47 = pcVar48->next;
                  if ((pcVar47->info).penult_phn_wid < 0) {
                    if (((pcVar47->hmm).frame < (int)uVar34) || ((pcVar47->hmm).score[0] < iVar46))
                    {
                      pcStack_a0 = (code *)0x1383d7;
                      hmm_enter(&pcVar47->hmm,iVar46,(pcVar48->hmm).out_history,iVar17);
                    }
                  }
                  else {
                    for (; pcVar47 != (chan_s *)0x0; pcVar47 = pcVar47->next) {
                      if (((pcVar47->hmm).frame < (int)uVar34) || ((pcVar47->hmm).score[0] < iVar46)
                         ) {
                        pcStack_a0 = (code *)0x1383fb;
                        hmm_enter(&pcVar47->hmm,iVar46,(pcVar48->hmm).out_history,iVar17);
                      }
                    }
                  }
                }
              }
              else if (iStack_80 < iVar46) {
                pcStack_a0 = (code *)0x13838d;
                ngram_search_save_bp
                          (pnStack_98,uVar34,(int32)uStack_78,iVar46,(pcVar48->hmm).out_history,
                           (pcVar48->info).penult_phn_wid);
              }
            }
            else if (iVar46 != iVar17) {
              pcStack_a0 = (code *)0x13839c;
              hmm_clear_scores(&pcVar48->hmm);
            }
          }
        }
        iVar37 = (int)uStack_48 + 1;
      }
      piVar49 = (int *)(long)(int)uStack_8c;
      uStack_60 = (ulong)uStack_8c;
      pdStack_88 = (pnStack_98->base).dict;
      pdStack_50 = (pnStack_98->base).d2p;
      uStack_78 = CONCAT44(uStack_78._4_4_,pnStack_98->pip);
      fStack_7c = pnStack_98->fwdflat_fwdtree_lw_ratio;
      iStack_80 = pnStack_98->fwdflatbeam + pnStack_98->best_score;
      if (pnStack_98->fwdtree != '\0') {
        uVar34 = uStack_8c - pnStack_98->max_sf_win;
        if ((int)uVar34 < 1) {
          uVar34 = 0;
        }
        uVar35 = (ulong)uVar34;
        iVar46 = uStack_8c + pnStack_98->max_sf_win;
        iVar17 = pnStack_98->n_frame;
        if (iVar46 < pnStack_98->n_frame) {
          iVar17 = iVar46;
        }
        pcStack_a0 = (code *)0x1384c0;
        memset(pnStack_98->expand_word_flag,0,
               (long)(((pnStack_98->base).n_words + 0x1f) / 0x20) << 2);
        pnStack_98->n_expand_words = 0;
        for (; (long)uVar35 < (long)iVar17; uVar35 = uVar35 + 1) {
          pppVar41 = pnStack_98->frm_wordlist + uVar35;
          while (ppVar7 = *pppVar41, ppVar7 != (ps_latnode_t *)0x0) {
            pbVar8 = pnStack_98->expand_word_flag;
            uVar34 = ppVar7->wid;
            if ((pbVar8[(int)uVar34 / 0x20] >> (uVar34 & 0x1f) & 1) == 0) {
              iVar46 = pnStack_98->n_expand_words;
              pnStack_98->n_expand_words = iVar46 + 1;
              pnStack_98->expand_word_list[iVar46] = uVar34;
              puVar23 = pbVar8 + ppVar7->wid / 0x20;
              *puVar23 = *puVar23 | 1 << ((byte)ppVar7->wid & 0x1f);
            }
            pppVar41 = &ppVar7->next;
          }
        }
        pnStack_98->expand_word_list[pnStack_98->n_expand_words] = -1;
      }
      iStack_6c = uVar27 + 1;
      piVar25 = &(pnStack_98->st).n_fwdflat_word_transition;
      *piVar25 = *piVar25 + pnStack_98->n_expand_words;
      iStack_70 = -0x20000000;
      uStack_58 = 0;
      pnVar44 = pnStack_98;
      piStack_68 = piVar49;
      for (uVar35 = (ulong)pnStack_98->bp_table_idx[(long)piVar49];
          (long)uVar35 < (long)pnVar44->bpidx; uVar35 = uVar35 + 1) {
        pbVar39 = pnVar44->bp_table;
        pnVar44->word_lat_idx[pbVar39[uVar35].wid] = -1;
        if (pbVar39[uVar35].wid != (pnVar44->base).finish_wid) {
          if ((long)pbVar39[uVar35].last2_phone == -1) {
            pxVar50 = (xwdssid_t *)0x0;
          }
          else {
            pxVar50 = pdStack_50->rssid[pbVar39[uVar35].last_phone] + pbVar39[uVar35].last2_phone;
          }
          piStack_40 = pnVar44->bscore_stack + pbVar39[uVar35].s_idx;
          piVar25 = &pbVar39[uVar35].score;
          lVar36 = 0;
          uStack_48 = uVar35;
          while( true ) {
            uVar27 = *(uint *)((long)pnVar44->expand_word_list + lVar36);
            lVar56 = (long)(int)uVar27;
            if (lVar56 < 0) break;
            piVar22 = piVar25;
            if (pxVar50 != (xwdssid_t *)0x0) {
              piVar22 = piStack_40 + pxVar50->cimap[*pdStack_88->word[lVar56].ciphone];
            }
            iVar17 = *piVar22;
            if (iVar17 != -0x20000000) {
              pcStack_a0 = (code *)0x13869a;
              iVar18 = ngram_tg_score(pnVar44->lmset,pdStack_88->word[lVar56].basewid,
                                      pbVar39[uVar35].real_wid,pbVar39[uVar35].prev_real_wid,
                                      &iStack_34);
              iVar17 = (int)((float)iVar17 + (float)(iVar18 >> 10) * (float)fStack_7c) +
                       (int)uStack_78;
              pnVar44 = pnStack_98;
              if ((iStack_80 < iVar17) &&
                 ((pcVar48 = pnStack_98->word_chan[lVar56], (pcVar48->hmm).frame < (int)piStack_68
                  || ((pcVar48->hmm).score[0] < iVar17)))) {
                pcStack_a0 = (code *)0x1386f0;
                hmm_enter(&pcVar48->hmm,iVar17,(int32)uStack_48,iStack_6c);
                uVar2 = pdStack_50->ldiph_lc[(short)pcVar48->ciphone]
                        [*(short *)((long)&pcVar48->ciphone + 2)]
                        [pdStack_88->word[pbVar39[uVar35].wid].ciphone
                         [(long)pdStack_88->word[pbVar39[uVar35].wid].pronlen + -1]];
                (pcVar48->hmm).senid[0] = uVar2;
                if (uVar2 == 0xffff) {
                  pcStack_a0 = (code *)0x1389e1;
                  __assert_fail("IS_S3SSID(hmm_mpx_ssid(&rhmm->hmm, 0))",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                                ,0x2d0,"void fwdflat_word_transition(ngram_search_t *, int)");
                }
                pnStack_98->word_active[uVar27 >> 5] =
                     pnStack_98->word_active[uVar27 >> 5] | 1 << ((byte)uVar27 & 0x1f);
                pnVar44 = pnStack_98;
              }
            }
            lVar36 = lVar36 + 4;
          }
          if (pxVar50 != (xwdssid_t *)0x0) {
            piVar25 = piStack_40 + pxVar50->cimap[((pnVar44->base).acmod)->mdef->sil];
          }
          iVar17 = *piVar25;
          if (iStack_70 < iVar17) {
            uStack_58 = uStack_48;
          }
          uStack_58 = uStack_58 & 0xffffffff;
          uVar35 = uStack_48;
          piVar49 = piStack_68;
          if (iStack_70 < iVar17) {
            iStack_70 = iVar17;
          }
        }
      }
      iVar17 = iStack_70 + (int)uStack_78;
      iVar46 = pnVar44->silpen + iVar17;
      if (-0x20000000 < iVar46 && iStack_80 < iVar46) {
        iVar37 = (pnVar44->base).silence_wid;
        pcVar48 = pnVar44->word_chan[iVar37];
        if (((pcVar48->hmm).frame < (int)uStack_60) || ((pcVar48->hmm).score[0] < iVar46)) {
          pcStack_a0 = (code *)0x13880c;
          hmm_enter(&pcVar48->hmm,iVar46,(int32)uStack_58,iStack_6c);
          pnStack_98->word_active[iVar37 / 0x20] =
               pnStack_98->word_active[iVar37 / 0x20] | 1 << ((byte)iVar37 & 0x1f);
          pnVar44 = pnStack_98;
        }
      }
      iVar17 = iVar17 + pnVar44->fillpen;
      if (-0x20000000 < iVar17 && iStack_80 < iVar17) {
        for (uVar35 = (ulong)pdStack_88->filler_start; (long)uVar35 <= (long)pdStack_88->filler_end;
            uVar35 = uVar35 + 1) {
          if ((((int)uVar35 != (pnVar44->base).silence_wid) &&
              (pcVar48 = pnVar44->word_chan[uVar35], pcVar48 != (chan_t *)0x0)) &&
             (((pcVar48->hmm).frame < (int)uStack_60 || ((pcVar48->hmm).score[0] < iVar17)))) {
            pcStack_a0 = (code *)0x138897;
            hmm_enter(&pcVar48->hmm,iVar17,(int32)uStack_58,iStack_6c);
            pnStack_98->word_active
            [(int)((long)((ulong)(uint)((int)uVar35 >> 0x1f) << 0x20 | uVar35 & 0xffffffff) / 0x20)]
                 = pnStack_98->word_active
                   [(int)((long)((ulong)(uint)((int)uVar35 >> 0x1f) << 0x20 | uVar35 & 0xffffffff) /
                         0x20)] | 1 << ((byte)uVar35 & 0x1f);
            pnVar44 = pnStack_98;
          }
        }
      }
      uVar27 = (uint)uStack_60 & 1;
      piVar25 = pnVar44->active_word_list[uVar27];
      uVar57 = 0;
      uVar35 = (ulong)(uint)pnVar44->n_active_word[uVar27];
      if (pnVar44->n_active_word[uVar27] < 1) {
        uVar35 = uVar57;
      }
      for (; (int)uVar35 != (int)uVar57; uVar57 = uVar57 + 1) {
        if ((pnVar44->word_chan[piVar25[uVar57]]->hmm).frame == (int)piVar49) {
          pcStack_a0 = (code *)0x1388fd;
          hmm_clear_scores(&pnVar44->word_chan[piVar25[uVar57]]->hmm);
          pnVar44 = pnStack_98;
        }
      }
      puVar43 = (uint *)pnVar44->active_word_list[~uStack_8c & 1];
      iVar17 = 0;
      for (puVar23 = (uint *)pnVar44->fwdflat_wordlist; uVar27 = *puVar23, -1 < (int)uVar27;
          puVar23 = puVar23 + 1) {
        if (((pnVar44->word_active[uVar27 >> 5] >> (uVar27 & 0x1f) & 1) != 0) &&
           ((int)uVar27 < (pnVar44->base).start_wid)) {
          *puVar43 = uVar27;
          puVar43 = puVar43 + 1;
          iVar17 = iVar17 + 1;
        }
      }
      uVar27 = (pnVar44->base).start_wid;
      for (; (int)uVar27 < (pnVar44->base).n_words; uVar27 = uVar27 + 1) {
        if ((pnVar44->word_active[(int)uVar27 / 0x20] >> (uVar27 & 0x1f) & 1) != 0) {
          *puVar43 = uVar27;
          puVar43 = puVar43 + 1;
          iVar17 = iVar17 + 1;
        }
        pnVar44 = pnStack_98;
      }
      if (pnVar44->fwdtree == '\0') {
        pnVar44->n_frame = pnVar44->n_frame + 1;
      }
      pnVar44->n_active_word[~uStack_8c & 1] = iVar17;
      iVar17 = 1;
    }
    return iVar17;
  }
  paVar42 = search->acmod;
  uStack_46c = frame_idx;
  if (paVar42->compallsen == '\0') {
    acmod_clear_active(paVar42);
    phVar53 = (hmm_t *)search[1].dict;
    for (iVar17 = *(int *)((long)&search[1].d2p + 4); 0 < iVar17; iVar17 = iVar17 + -1) {
      if (phVar53->frame == frame_idx) {
        acmod_activate_hmm(search->acmod,phVar53);
      }
      phVar53 = (hmm_t *)(phVar53[1].score + 4);
    }
    uVar35 = (ulong)(frame_idx & 1);
    puVar38 = *(undefined8 **)(search[2].type + uVar35 * 8);
    for (iVar17 = *(int *)((long)&search[2].name + uVar35 * 4); 0 < iVar17; iVar17 = iVar17 + -1) {
      phVar53 = (hmm_t *)*puVar38;
      puVar38 = puVar38 + 1;
      acmod_activate_hmm(search->acmod,phVar53);
    }
    ppVar32 = (&(search[2].pls)->vt)[uVar35];
    for (iVar17 = *(int *)((long)&search[2].config + uVar35 * 4); 0 < iVar17; iVar17 = iVar17 + -1)
    {
      pp_Var16 = &ppVar32->start;
      ppVar32 = (ps_searchfuncs_t *)((long)&ppVar32->start + 4);
      for (phVar53 = (hmm_t *)(&(search[1].last_link)->from + *(int *)pp_Var16);
          phVar53 = (hmm_t *)phVar53->ctx, phVar53 != (hmm_t *)0x0; phVar53 = phVar53 + 1) {
        acmod_activate_hmm(search->acmod,phVar53);
      }
    }
    for (lVar36 = 0; lVar36 < *(int *)&search[2].vt; lVar36 = lVar36 + 1) {
      phVar53 = (hmm_t *)(&(search[1].last_link)->from)
                         [*(int *)(*(long *)&search[1].finish_wid + lVar36 * 4)];
      if (phVar53->frame == frame_idx) {
        acmod_activate_hmm(search->acmod,phVar53);
      }
    }
    paVar42 = search->acmod;
  }
  piVar24 = acmod_score(paVar42,(int *)&uStack_46c);
  iVar17 = 0;
  if (piVar24 != (int16 *)0x0) {
    *(int *)&search[4].pls = *(int *)&search[4].pls + search->acmod->n_senone_active;
    ngram_search_mark_bptable((ngram_search_t *)search,uStack_46c);
    if (-0x20000000 < *(int *)&search[3].last_link) {
      if (*(int *)&search[3].last_link + search[5].n_words * 2 < -0x20000000) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                ,0x5c5,"Renormalizing Scores at frame %d, best score %d\n",(ulong)uStack_46c);
        uVar27 = uStack_46c;
        iVar18 = *(int32 *)&search[3].last_link;
        phVar53 = (hmm_t *)search[1].dict;
        for (iVar17 = *(int *)((long)&search[1].d2p + 4); 0 < iVar17; iVar17 = iVar17 + -1) {
          if (phVar53->frame == uVar27) {
            hmm_normalize(phVar53,iVar18);
          }
          phVar53 = (hmm_t *)(phVar53[1].score + 4);
        }
        uVar35 = (ulong)(uVar27 & 1);
        puVar38 = *(undefined8 **)(search[2].type + uVar35 * 8);
        for (iVar17 = *(int *)((long)&search[2].name + uVar35 * 4); 0 < iVar17; iVar17 = iVar17 + -1
            ) {
          phVar53 = (hmm_t *)*puVar38;
          puVar38 = puVar38 + 1;
          hmm_normalize(phVar53,iVar18);
        }
        ppVar32 = (&(search[2].pls)->vt)[uVar35];
        for (iVar17 = *(int *)((long)&search[2].config + uVar35 * 4); 0 < iVar17;
            iVar17 = iVar17 + -1) {
          pp_Var16 = &ppVar32->start;
          ppVar32 = (ps_searchfuncs_t *)((long)&ppVar32->start + 4);
          for (phVar53 = (hmm_t *)(&(search[1].last_link)->from + *(int *)pp_Var16);
              phVar53 = (hmm_t *)phVar53->ctx, phVar53 != (hmm_t *)0x0; phVar53 = phVar53 + 1) {
            hmm_normalize(phVar53,iVar18);
          }
        }
        for (lVar36 = 0; lVar36 < *(int *)&search[2].vt; lVar36 = lVar36 + 1) {
          phVar53 = (hmm_t *)(&(search[1].last_link)->from)
                             [*(int *)(*(long *)&search[1].finish_wid + lVar36 * 4)];
          if (phVar53->frame == uVar27) {
            hmm_normalize(phVar53,iVar18);
          }
        }
        search[3].post = 1;
      }
      uVar27 = uStack_46c;
      *(int16 **)(search[1].type + 0x10) = piVar24;
      phVar53 = (hmm_t *)search[1].dict;
      iVar46 = -0x20000000;
      for (iVar17 = *(int *)((long)&search[1].d2p + 4); 0 < iVar17; iVar17 = iVar17 + -1) {
        if (phVar53->frame == uVar27) {
          iVar18 = hmm_vit_eval(phVar53);
          if (iVar46 < iVar18) {
            iVar46 = iVar18;
          }
          search[3].finish_wid = search[3].finish_wid + 1;
        }
        phVar53 = (hmm_t *)(phVar53[1].score + 4);
      }
      *(int *)&search[3].last_link = iVar46;
      uStack_468 = (ulong)(uVar27 & 1);
      iVar17 = *(int *)((long)&search[2].name + uStack_468 * 4);
      puVar38 = *(undefined8 **)(search[2].type + uStack_468 * 8);
      *(int *)&search[3].field_0x6c = *(int *)&search[3].field_0x6c + iVar17;
      iVar46 = -0x20000000;
      for (; 0 < iVar17; iVar17 = iVar17 + -1) {
        phVar53 = (hmm_t *)*puVar38;
        iVar18 = hmm_vit_eval(phVar53);
        if (phVar53->frame != uVar27) {
          __assert_fail("hmm_frame(&hmm->hmm) == frame_idx",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                        ,0x27c,"int32 eval_nonroot_chan(ngram_search_t *, int)");
        }
        puVar38 = puVar38 + 1;
        if (iVar46 < iVar18) {
          iVar46 = iVar18;
        }
      }
      if (*(int *)&search[3].last_link < iVar46) {
        *(int *)&search[3].last_link = iVar46;
      }
      ppStack_490 = (&(search[2].pls)->vt)[uStack_468];
      iVar37 = 0;
      iVar46 = -0x20000000;
      for (iVar17 = *(int *)((long)&search[2].config + uStack_468 * 4); 0 < iVar17;
          iVar17 = iVar17 + -1) {
        uVar34 = *(uint *)&ppStack_490->start;
        uVar6 = *(uint *)(*(long *)&search[1].post + (long)((int)uVar34 / 0x20) * 4);
        if ((uVar6 >> (uVar34 & 0x1f) & 1) == 0) {
          __assert_fail("bitvec_is_set(ngs->word_active, w)",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                        ,0x291,"int32 eval_word_chan(ngram_search_t *, int)");
        }
        *(uint *)(*(long *)&search[1].post + (long)((int)uVar34 / 0x20) * 4) =
             uVar6 & ~(uint)(1L << ((byte)uVar34 & 0x1f));
        phVar53 = (hmm_t *)(&(search[1].last_link)->from)[(int)uVar34];
        if (phVar53 == (hmm_t *)0x0) {
          __assert_fail("ngs->word_chan[w] != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                        ,0x293,"int32 eval_word_chan(ngram_search_t *, int)");
        }
        ppStack_490 = (ps_searchfuncs_t *)((long)&ppStack_490->start + 4);
        for (; phVar53 != (hmm_t *)0x0; phVar53 = (hmm_t *)phVar53[1].ctx) {
          if (phVar53->frame != uVar27) {
            __assert_fail("hmm_frame(&hmm->hmm) == frame_idx",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x298,"int32 eval_word_chan(ngram_search_t *, int)");
          }
          iVar18 = hmm_vit_eval(phVar53);
          if (iVar46 < iVar18) {
            iVar46 = iVar18;
          }
          iVar37 = iVar37 + 1;
        }
      }
      iVar17 = 0;
      for (lVar36 = 0; uVar34 = uStack_46c, lVar36 < *(int *)&search[2].vt; lVar36 = lVar36 + 1) {
        iVar45 = *(int *)(*(long *)&search[1].finish_wid + lVar36 * 4);
        phVar53 = (hmm_t *)(&(search[1].last_link)->from)[iVar45];
        if ((int)uVar27 <= phVar53->frame) {
          iVar18 = hmm_vit_eval(phVar53);
          if ((iVar46 < iVar18) && (iVar45 != search->finish_wid)) {
            iVar46 = iVar18;
          }
          iVar17 = iVar17 + 1;
        }
      }
      *(int *)&search[4].vt = *(int *)&search[4].vt + iVar37 + iVar17;
      iVar37 = iVar37 + iVar17 + *(int *)&search[3].field_0x6c;
      *(int *)&search[3].field_0x6c = iVar37;
      piVar49 = (int *)((long)&search[4].vt + 4);
      *piVar49 = *piVar49 + iVar17 + *(int *)((long)&search[2].config + uStack_468 * 4);
      iVar17 = *(int *)&search[3].last_link;
      if (*(int *)&search[3].last_link < iVar46) {
        *(int *)&search[3].last_link = iVar46;
        iVar17 = iVar46;
      }
      *(int *)((long)&search[3].last_link + 4) = iVar46;
      *(undefined4 *)&search[2].dict = 0;
      iVar46 = search[5].n_words;
      iVar45 = *(int *)((long)&search[6].config + 4);
      search[5].start_wid = iVar46;
      if (iVar45 == -1) {
        pdVar21 = search[1].dict;
      }
      else {
        pdVar21 = search[1].dict;
        if (iVar45 < iVar37 + search[3].finish_wid) {
          iVar46 = iVar46 / -0x100;
          memset(aiStack_438,0,0x400);
          iVar37 = *(int *)((long)&search[1].d2p + 4);
          iVar55 = 0;
          if (0 < iVar37) {
            iVar55 = iVar37;
          }
          piVar49 = (int *)&pdVar21[1].field_0x4;
          while (bVar58 = iVar55 != 0, iVar55 = iVar55 + -1, bVar58) {
            iVar37 = (iVar17 - *piVar49) / iVar46;
            if (0xfe < iVar37) {
              iVar37 = 0xff;
            }
            aiStack_438[iVar37] = aiStack_438[iVar37] + 1;
            piVar49 = piVar49 + 0x1c;
          }
          plVar29 = *(long **)(search[2].type + (ulong)(uVar34 & 1) * 8);
          for (iVar37 = *(int *)((long)&search[2].name + (ulong)(uVar34 & 1) * 4); 0 < iVar37;
              iVar37 = iVar37 + -1) {
            iVar55 = (iVar17 - *(int *)(*plVar29 + 0x44)) / iVar46;
            if (0xfe < iVar55) {
              iVar55 = 0xff;
            }
            plVar29 = plVar29 + 1;
            aiStack_438[iVar55] = aiStack_438[iVar55] + 1;
          }
          iVar37 = 0;
          for (lVar36 = 0; lVar36 != 0x100; lVar36 = lVar36 + 1) {
            iVar37 = iVar37 + aiStack_438[lVar36];
            if (iVar45 < iVar37) goto LAB_00139f9b;
          }
          lVar36 = 0x100;
LAB_00139f9b:
          iVar46 = -(iVar46 * (int)lVar36);
          search[5].start_wid = iVar46;
        }
      }
      uVar27 = uVar34 + 1;
      iVar37 = search[5].silence_wid + iVar17;
      iVar55 = iVar17 + *(int *)&search[5].field_0x6c;
      ppVar33 = search->pls;
      uStack_450 = (ulong)(uVar27 & 1);
      puVar38 = *(undefined8 **)(search[2].type + uStack_450 * 8);
      uStack_468 = CONCAT44(uStack_468._4_4_,uVar27);
      ppStack_460 = ppVar33;
      for (iVar45 = 0; iVar45 < *(int *)((long)&search[1].d2p + 4); iVar45 = iVar45 + 1) {
        if (((int)uVar34 <= *(int *)((long)&pdVar21[1].mdef + 4)) &&
           (iVar46 + iVar17 < *(int *)&pdVar21[1].field_0x4)) {
          *(uint *)((long)&pdVar21[1].mdef + 4) = uVar27;
          iVar40 = *(int *)((long)&search[6].pls + 4) + pdVar21->startwid;
          if ((ppVar33 != (ps_search_t *)0x0) || (iVar37 < iVar40)) {
            ppStack_458 = (ps_searchfuncs_t *)CONCAT44(ppStack_458._4_4_,iVar40);
            pphVar51 = &pdVar21[1].ht;
            while (phVar53 = (hmm_t *)*pphVar51, phVar53 != (hmm_t *)0x0) {
              if (ppVar33 == (ps_search_t *)0x0) {
                iVar19 = 0;
              }
              else {
                iVar19 = *(int *)((long)&(ppVar33[1].acmod)->config + (long)phVar53[1].score[2] * 4)
                ;
              }
              if ((iVar37 < iVar19 + iVar40) &&
                 ((phVar53->frame < (int)uVar34 || (phVar53->score[0] < iVar40)))) {
                hmm_enter(phVar53,iVar40,pdVar21->finishwid,(int)uStack_468);
                *puVar38 = phVar53;
                puVar38 = puVar38 + 1;
                ppVar33 = ppStack_460;
                iVar40 = (int)ppStack_458;
              }
              pphVar51 = (hash_table_t **)phVar53[1].score;
            }
          }
          if ((ppVar33 != (ps_search_t *)0x0) || (iVar55 < iVar40)) {
            piVar25 = &pdVar21[1].max_words;
            while( true ) {
              iVar19 = *piVar25;
              lVar36 = (long)iVar19;
              if (lVar36 < 0) break;
              if (ppVar33 == (ps_search_t *)0x0) {
                iVar28 = 0;
              }
              else {
                pdVar9 = search->dict->word;
                iVar28 = *(int *)((long)&(ppVar33[1].acmod)->config +
                                 (long)pdVar9[lVar36].ciphone[(long)pdVar9[lVar36].pronlen + -1] * 4
                                 );
              }
              if (iVar55 < iVar28 + iVar40) {
                paVar42 = search[2].acmod;
                lVar56 = (long)*(int *)&search[2].dict;
                *(int *)&search[2].dict = *(int *)&search[2].dict + 1;
                *(int *)(&paVar42->config + lVar56 * 2) = iVar19;
                *(int *)((long)&paVar42->config + lVar56 * 0x10 + 4) =
                     iVar40 - *(int *)&search[6].pls;
                *(s3wid_t *)(&paVar42->lmath + lVar56 * 2) = pdVar21->finishwid;
              }
              piVar25 = (int32 *)(lVar36 * 4 + *(long *)&search[1].start_wid);
            }
          }
        }
        pdVar21 = (dict_t *)&pdVar21[1].startwid;
      }
      pcVar10 = search[2].type;
      lVar36 = *(long *)(pcVar10 + uStack_450 * 8);
      iVar37 = (int)((ulong)((long)puVar38 - lVar36) >> 3);
      *(int *)((long)&search[2].name + uStack_450 * 4) = iVar37;
      iVar17 = *(int *)&search[3].last_link;
      iVar46 = search[5].start_wid;
      iVar45 = search[5].silence_wid + iVar17;
      iVar55 = iVar17 + *(int *)&search[5].field_0x6c;
      ppVar33 = search->pls;
      uVar27 = uVar34 & 1;
      uStack_440 = (ulong)uVar27;
      puVar38 = *(undefined8 **)(pcVar10 + (ulong)uVar27 * 8);
      puStack_478 = (undefined8 *)(lVar36 + (long)iVar37 * 8);
      iVar37 = *(int *)((long)&search[2].name + (ulong)uVar27 * 4);
      ppStack_458 = (ps_searchfuncs_t *)CONCAT44(ppStack_458._4_4_,iVar45);
      while (0 < iVar37) {
        ppStack_460 = (ps_search_t *)CONCAT44(ppStack_460._4_4_,iVar37);
        phVar53 = (hmm_t *)*puVar38;
        iVar37 = phVar53->frame;
        if (iVar37 < (int)uVar34) {
          __assert_fail("hmm_frame(&hmm->hmm) >= frame_idx",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                        ,0x335,"void prune_nonroot_chan(ngram_search_t *, int)");
        }
        if (iVar46 + iVar17 < phVar53->bestscore) {
          if (iVar37 != (int)uStack_468) {
            phVar53->frame = (int)uStack_468;
            *puStack_478 = phVar53;
            puStack_478 = puStack_478 + 1;
          }
          iVar37 = *(int *)((long)&search[6].pls + 4) + phVar53->out_score;
          if ((ppVar33 != (ps_search_t *)0x0) || (iVar45 < iVar37)) {
            for (phVar52 = phVar53 + 1; phVar52 = (hmm_t *)phVar52->ctx, phVar52 != (hmm_t *)0x0;
                phVar52 = (hmm_t *)phVar52[1].score) {
              if (ppVar33 == (ps_search_t *)0x0) {
                iVar40 = 0;
              }
              else {
                iVar40 = *(int *)((long)&(ppVar33[1].acmod)->config + (long)phVar52[1].score[2] * 4)
                ;
              }
              if ((iVar45 < iVar40 + iVar37) &&
                 ((phVar52->frame < (int)uVar34 || (phVar52->score[0] < iVar37)))) {
                if (phVar52->frame != (int)uStack_468) {
                  *puStack_478 = phVar52;
                  puStack_478 = puStack_478 + 1;
                }
                hmm_enter(phVar52,iVar37,phVar53->out_history,(int)uStack_468);
                iVar45 = (int)ppStack_458;
              }
            }
          }
          if ((ppVar33 != (ps_search_t *)0x0) || (iVar55 < iVar37)) {
            piVar25 = phVar53[1].score + 3;
            while( true ) {
              iVar40 = *piVar25;
              lVar36 = (long)iVar40;
              if (lVar36 < 0) break;
              if (ppVar33 == (ps_search_t *)0x0) {
                iVar19 = 0;
              }
              else {
                pdVar9 = search->dict->word;
                iVar19 = *(int *)((long)&(ppVar33[1].acmod)->config +
                                 (long)pdVar9[lVar36].ciphone[(long)pdVar9[lVar36].pronlen + -1] * 4
                                 );
              }
              if (iVar55 < iVar19 + iVar37) {
                paVar42 = search[2].acmod;
                lVar56 = (long)*(int *)&search[2].dict;
                *(int *)&search[2].dict = *(int *)&search[2].dict + 1;
                *(int *)(&paVar42->config + lVar56 * 2) = iVar40;
                *(int *)((long)&paVar42->config + lVar56 * 0x10 + 4) =
                     iVar37 - *(int *)&search[6].pls;
                *(int32 *)(&paVar42->lmath + lVar56 * 2) = phVar53->out_history;
              }
              piVar25 = (int32 *)(lVar36 * 4 + *(long *)&search[1].start_wid);
            }
          }
        }
        else if (iVar37 != (int)uStack_468) {
          hmm_clear(phVar53);
          iVar45 = (int)ppStack_458;
        }
        puVar38 = puVar38 + 1;
        iVar37 = (int)ppStack_460 + -1;
      }
      uVar35 = (ulong)(uint)((int)uStack_450 * 8);
      *(int *)((long)&search[2].name + uStack_450 * 4) =
           (int)((ulong)((long)puStack_478 - *(long *)(search[2].type + uVar35)) >> 3);
      paVar42 = search[2].acmod;
      puStack_480 = *(uint **)((long)&(search[2].pls)->vt + uVar35);
      iVar17 = *(int *)&search[2].dict;
      *(int *)&search[4].type = *(int *)&search[4].type + iVar17;
      uVar27 = 0;
      for (iVar46 = 0; iVar46 < iVar17; iVar46 = iVar46 + 1) {
        if ((long)*(int *)&paVar42->lmath != -1) {
          pbVar39 = (bptbl_t *)((long)*(int *)&paVar42->lmath * 0x24 + *(long *)&search[2].post);
          iVar18 = ngram_search_exit_score
                             ((ngram_search_t *)search,pbVar39,
                              (int)*search->dict->word[*(int *)&paVar42->config].ciphone);
          if (iVar18 < -0x1fffffff) {
            __assert_fail("start_score BETTER_THAN WORST_SCORE",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x392,"void last_phone_transition(ngram_search_t *, int)");
          }
          piVar49 = (int *)((long)&paVar42->config + 4);
          *piVar49 = *piVar49 - iVar18;
          pdVar30 = search[2].d2p;
          lVar36 = (long)*(int *)&paVar42->config;
          iVar17 = pbVar39->frame + 1;
          if ((&pdVar30->refcount)[lVar36 * 3] != iVar17) {
            uVar35 = 0;
            if (0 < (int)uVar27) {
              uVar35 = (ulong)uVar27;
            }
            for (uVar57 = 0; uVar35 != uVar57; uVar57 = uVar57 + 1) {
              ppVar26 = search[2].dag;
              if ((&ppVar26->refcount)[uVar57 * 2] == pbVar39->frame) {
                *(undefined4 *)((long)&paVar42->lmath + 4) =
                     *(undefined4 *)(&ppVar26->field_0x4 + uVar57 * 8);
                goto LAB_0013a512;
              }
            }
            iVar17 = *(int *)&search[2].hyp_str;
            if (iVar17 <= (int)uVar27) {
              if (iVar17 == 0) {
                ppVar26 = (ps_lattice_t *)
                          __ckd_calloc__(0x20,8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                         ,0x3ab);
                search[2].dag = ppVar26;
                *(undefined4 *)&search[2].hyp_str = 0x20;
              }
              else {
                *(int *)&search[2].hyp_str = iVar17 + 0x20;
                ppVar26 = (ps_lattice_t *)
                          __ckd_realloc__(search[2].dag,(long)iVar17 * 8 + 0x100,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                          ,0x3b2);
                search[2].dag = ppVar26;
                err_msg(ERR_INFO,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                        ,0x3b4,"cand_sf[] increased to %d entries\n",
                        (ulong)*(uint *)&search[2].hyp_str);
              }
            }
            *(undefined4 *)((long)&paVar42->lmath + 4) = 0xffffffff;
            iVar17 = pbVar39->frame;
            ppVar26 = search[2].dag;
            uVar57 = (ulong)(int)uVar27;
            uVar27 = uVar27 + 1;
            (&ppVar26->refcount)[uVar57 * 2] = iVar17;
            pdVar30 = search[2].d2p;
            lVar36 = (long)*(int *)&paVar42->config;
            iVar17 = iVar17 + 1;
LAB_0013a512:
            *(int *)(&ppVar26->field_0x4 + uVar57 * 8) = iVar46;
            *(undefined4 *)(&pdVar30->field_0x4 + lVar36 * 0xc) = 0xe0000000;
            (&pdVar30->refcount)[lVar36 * 3] = iVar17;
          }
        }
        paVar42 = (acmod_t *)&paVar42->strings;
        iVar17 = *(int *)&search[2].dict;
      }
      ppVar32 = (ps_searchfuncs_t *)0x0;
      ppStack_460 = (ps_search_t *)(ulong)uVar27;
      if ((int)uVar27 < 1) {
        ppStack_460 = (ps_search_t *)ppVar32;
      }
      while ((ps_search_t *)ppVar32 != ppStack_460) {
        lVar36 = (long)(&(search[2].dag)->refcount)[(long)ppVar32 * 2];
        uVar35 = (ulong)*(int *)(search[3].name + lVar36 * 4);
        iVar17 = *(int *)(search[3].name + lVar36 * 4 + 4);
        pbVar39 = (bptbl_t *)(uVar35 * 0x24 + *(long *)&search[2].post);
        ppStack_458 = ppVar32;
        while (iVar46 = (int)uVar35, iVar46 < iVar17) {
          if (pbVar39->valid != '\0') {
            piVar49 = (int *)(&(search[2].dag)->field_0x4 + (long)ppStack_458 * 8);
            while (lVar36 = (long)*piVar49, -1 < lVar36) {
              pppVar1 = &(search[2].acmod)->config + lVar36 * 2;
              iVar18 = ngram_search_exit_score
                                 ((ngram_search_t *)search,pbVar39,
                                  (int)*search->dict->word
                                        [*(int *)(&(search[2].acmod)->config + lVar36 * 2)].ciphone)
              ;
              if (-0x20000000 < iVar18) {
                iVar37 = dict_filler_word(search->dict,*(s3wid_t *)pppVar1);
                if (iVar37 != 0) {
                  __assert_fail("!dict_filler_word(ps_search_dict(ngs), candp->wid)",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                ,0x3d5,"void last_phone_transition(ngram_search_t *, int)");
                }
                iVar20 = ngram_tg_score((ngram_model_t *)search[1].vt,
                                        search->dict->word[*(int *)pppVar1].basewid,
                                        pbVar39->real_wid,pbVar39->prev_real_wid,aiStack_438);
                iVar18 = iVar18 + (iVar20 >> 10);
              }
              pdVar30 = search[2].d2p;
              lVar36 = (long)*(int *)pppVar1 * 0xc;
              if (*(int *)(&pdVar30->field_0x4 + lVar36) < iVar18) {
                *(int32 *)(&pdVar30->field_0x4 + lVar36) = iVar18;
                *(int *)((long)&pdVar30->mdef + lVar36) = iVar46;
              }
              piVar49 = (int *)((long)pppVar1 + 0xc);
            }
          }
          pbVar39 = pbVar39 + 1;
          uVar35 = (ulong)(iVar46 + 1);
        }
        ppVar32 = (ps_searchfuncs_t *)((long)&ppStack_458->start + 1);
      }
      iVar17 = *(int *)((long)&search[3].last_link + 4);
      paVar42 = search[2].acmod;
      iVar46 = *(int *)&search[2].dict;
      paVar31 = paVar42;
      iVar37 = 0;
      if (0 < iVar46) {
        iVar37 = iVar46;
      }
      while (iVar37 != 0) {
        pdVar30 = search[2].d2p;
        lVar36 = (long)*(int *)&paVar31->config * 0xc;
        iVar45 = *(int *)((long)&paVar31->config + 4) + *(int *)(&pdVar30->field_0x4 + lVar36);
        *(int *)((long)&paVar31->config + 4) = iVar45;
        *(undefined4 *)&paVar31->lmath = *(undefined4 *)((long)&pdVar30->mdef + lVar36);
        if (iVar17 < iVar45) {
          iVar17 = iVar45;
        }
        paVar31 = (acmod_t *)&paVar31->strings;
        iVar37 = iVar37 + -1;
      }
      *(int *)((long)&search[3].last_link + 4) = iVar17;
      iVar37 = *(int *)&search[6].vt;
      for (; 0 < iVar46; iVar46 = iVar46 + -1) {
        if (iVar17 + iVar37 < *(int *)((long)&paVar42->config + 4)) {
          uVar27 = *(uint *)&paVar42->config;
          ngram_search_alloc_all_rc((ngram_search_t *)search,uVar27);
          ppStack_458 = (ps_searchfuncs_t *)(long)(int)uVar27;
          iVar45 = 0;
          for (phVar53 = (hmm_t *)(&(search[1].last_link)->from + (long)ppStack_458);
              phVar53 = (hmm_t *)phVar53->ctx, phVar53 != (hmm_t *)0x0; phVar53 = phVar53 + 1) {
            if ((phVar53->frame < (int)uVar34) ||
               (phVar53->score[0] < *(int *)((long)&paVar42->config + 4))) {
              if (phVar53->frame == (int)uStack_468) {
                __assert_fail("hmm_frame(&hmm->hmm) != nf",
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                              ,0x3fc,"void last_phone_transition(ngram_search_t *, int)");
              }
              hmm_enter(phVar53,*(int32 *)((long)&paVar42->config + 4),*(int32 *)&paVar42->lmath,
                        (int)uStack_468);
              iVar45 = iVar45 + 1;
            }
          }
          if (0 < iVar45) {
            lVar36 = *(long *)&search[1].post;
            if ((*(uint *)(lVar36 + (long)((int)uVar27 / 0x20) * 4) >> (uVar27 & 0x1f) & 1) != 0) {
              __assert_fail("bitvec_is_clear(ngs->word_active, w)",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                            ,0x403,"void last_phone_transition(ngram_search_t *, int)");
            }
            if (search->dict->word[(long)ppStack_458].pronlen == 1) {
              __assert_fail("!dict_is_single_phone(ps_search_dict(ngs), w)",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                            ,0x404,"void last_phone_transition(ngram_search_t *, int)");
            }
            *puStack_480 = uVar27;
            puStack_480 = puStack_480 + 1;
            puVar23 = (uint *)(lVar36 + (long)((int)uVar27 / 0x20) * 4);
            *puVar23 = *puVar23 | (uint)(1L << ((byte)uVar27 & 0x1f));
          }
        }
        paVar42 = (acmod_t *)&paVar42->strings;
      }
      ppVar33 = search[2].pls;
      ppVar32 = (&ppVar33->vt)[uStack_450];
      iVar46 = (int)((ulong)((long)puStack_480 - (long)ppVar32) >> 2);
      *(int *)((long)&search[2].config + uStack_450 * 4) = iVar46;
      iVar17 = *(int *)((long)&search[3].last_link + 4);
      iVar37 = search[5].finish_wid + iVar17;
      iVar17 = iVar17 + *(int *)&search[6].vt;
      puStack_448 = (uint *)((long)&ppVar32->start + (long)iVar46 * 4);
      ppVar33 = (ps_search_t *)(&ppVar33->vt)[uStack_440];
      for (iVar46 = *(int *)((long)&search[2].config + uStack_440 * 4); 0 < iVar46;
          iVar46 = iVar46 + -1) {
        ppStack_458 = (ps_searchfuncs_t *)(ulong)*(uint *)&((ps_searchfuncs_t *)ppVar33)->start;
        ppStack_460 = (ps_search_t *)((long)&((ps_searchfuncs_t *)ppVar33)->start + 4);
        uStack_440 = (ulong)(int)*(uint *)&((ps_searchfuncs_t *)ppVar33)->start;
        phVar53 = (hmm_t *)(&(search[1].last_link)->from + uStack_440);
        iVar45 = 0;
        phVar52 = (hmm_t *)phVar53->ctx;
        while (hmm = phVar52, uVar27 = (uint)ppStack_458, hmm != (hmm_t *)0x0) {
          if (hmm->frame < (int)uVar34) {
            __assert_fail("hmm_frame(&hmm->hmm) >= frame_idx",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x428,"void prune_word_chan(ngram_search_t *, int)");
          }
          phVar52 = (hmm_t *)hmm[1].ctx;
          if (iVar17 < hmm->bestscore) {
            phVar53 = hmm + 1;
            hmm->frame = (int)uStack_468;
            iVar45 = iVar45 + 1;
            if (iVar37 < hmm->out_score) {
              ngram_search_save_bp
                        ((ngram_search_t *)search,uVar34,uVar27,hmm->out_score,hmm->out_history,
                         hmm[1].score[3]);
            }
          }
          else if (hmm->frame == (int)uStack_468) {
            phVar53 = hmm + 1;
          }
          else {
            hmm_deinit(hmm);
            __listelem_free__((listelem_alloc_t *)search[1].pls,hmm,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                              ,0x43f);
            phVar53->ctx = (hmm_context_t *)phVar52;
          }
        }
        if (iVar45 != 0) {
          lVar36 = *(long *)&search[1].post;
          lVar56 = (long)(int)((long)((ulong)(uint)((int)uVar27 >> 0x1f) << 0x20 |
                                     (ulong)ppStack_458 & 0xffffffff) / 0x20);
          if ((*(uint *)(lVar36 + lVar56 * 4) >> (uVar27 & 0x1f) & 1) == 0) {
            if (search->dict->word[uStack_440].pronlen == 1) {
              __assert_fail("!dict_is_single_phone(ps_search_dict(ngs), w)",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                            ,0x444,"void prune_word_chan(ngram_search_t *, int)");
            }
            *puStack_448 = uVar27;
            puStack_448 = puStack_448 + 1;
            puVar23 = (uint *)(lVar36 + lVar56 * 4);
            *puVar23 = *puVar23 | (uint)(1L << ((byte)ppStack_458 & 0x1f));
          }
        }
        ppVar33 = ppStack_460;
      }
      *(int *)((long)&search[2].config + uStack_450 * 4) =
           (int)((ulong)((long)puStack_448 - (long)(&(search[2].pls)->vt)[uStack_450]) >> 2);
      for (lVar36 = 0; lVar36 < *(int *)&search[2].vt; lVar36 = lVar36 + 1) {
        iVar46 = *(int *)(*(long *)&search[1].finish_wid + lVar36 * 4);
        ppVar11 = (&(search[1].last_link)->from)[iVar46];
        if (((int)uVar34 <= ppVar11[1].wid) && (iVar17 < *(int *)((long)&ppVar11->next + 4))) {
          ppVar11[1].wid = (int)uStack_468;
          if (iVar37 < *(int32 *)&ppVar11->entries) {
            ngram_search_save_bp
                      ((ngram_search_t *)search,uVar34,iVar46,*(int32 *)&ppVar11->entries,
                       *(int32 *)((long)&ppVar11->entries + 4),0);
          }
        }
      }
      puStack_480._0_4_ = uStack_46c;
      if ((*(int *)&search[6].config != -1) && (*(int *)&search[6].config != search->n_words)) {
        uStack_468 = (ulong)(int)uStack_46c;
        lVar56 = (long)*(int *)(search[3].name + uStack_468 * 4);
        lVar54 = lVar56 * 0x24;
        iVar17 = -0x80000000;
        iVar46 = 0;
        lVar36 = 0;
        while( true ) {
          iVar37 = search[2].start_wid;
          if (iVar37 <= lVar56) break;
          lVar12 = *(long *)&search[2].post;
          iVar37 = dict_filler_word(search->dict,*(s3wid_t *)(lVar12 + 8 + lVar54));
          if (iVar37 != 0) {
            iVar37 = *(int *)(lVar12 + 0x10 + lVar54);
            if (iVar17 < iVar37) {
              lVar36 = lVar12 + lVar54;
              iVar17 = iVar37;
            }
            *(undefined1 *)(lVar12 + 4 + lVar54) = 0;
            iVar46 = iVar46 + 1;
          }
          lVar56 = lVar56 + 1;
          lVar54 = lVar54 + 0x24;
        }
        if (lVar36 != 0) {
          *(undefined1 *)(lVar36 + 4) = 1;
          iVar46 = iVar46 + -1;
        }
        iVar17 = *(int *)(search[3].name + uStack_468 * 4);
        iVar45 = *(int *)&search[6].config;
        for (iVar46 = iVar37 - (iVar46 + iVar17); iVar45 < iVar46; iVar46 = iVar46 + -1) {
          iVar55 = 0x7fffffff;
          lVar36 = 0;
          lVar56 = (long)iVar17 * 0x24;
          for (lVar54 = (long)iVar17; lVar54 < iVar37; lVar54 = lVar54 + 1) {
            lVar12 = *(long *)&search[2].post;
            if (*(char *)(lVar12 + 4 + lVar56) != '\0') {
              iVar40 = *(int *)(lVar12 + 0x10 + lVar56);
              if (iVar40 < iVar55) {
                lVar36 = lVar12 + lVar56;
                iVar55 = iVar40;
              }
            }
            lVar56 = lVar56 + 0x24;
          }
          if (lVar36 == 0) {
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                    ,0x4d3,"PANIC: No worst BPtable entry remaining\n");
            exit(1);
          }
          *(undefined1 *)(lVar36 + 4) = 0;
        }
        puStack_480._0_4_ = uStack_46c;
      }
      pdVar21 = search->dict;
      ppStack_458 = (ps_searchfuncs_t *)search->d2p;
      pbVar13 = search->acmod->mdef;
      uVar35 = (ulong)(uint)pbVar13->n_ciphone;
      lVar36 = uVar35 * 0xc;
      while( true ) {
        lVar36 = lVar36 + -0xc;
        if ((int)uVar35 < 1) break;
        *(undefined4 *)((long)search[2].last_link + lVar36) = 0xe0000000;
        uVar35 = (ulong)((int)uVar35 - 1);
      }
      ppVar33 = search->pls;
      iVar17 = 0;
      for (lVar36 = (long)*(int *)(search[3].name + (long)(int)(uint)puStack_480 * 4);
          lVar36 < search[2].start_wid; lVar36 = lVar36 + 1) {
        lVar54 = lVar36 * 0x24;
        lVar56 = *(long *)&search[2].post;
        *(undefined4 *)((long)&(search[3].pls)->vt + (long)*(int *)(lVar56 + 8 + lVar54) * 4) =
             0xffffffff;
        if (*(int *)(lVar56 + 8 + lVar54) != search->finish_wid) {
          lVar56 = lVar56 + lVar54;
          iVar17 = iVar17 + 1;
          sVar3 = *(short *)(lVar56 + 0x22);
          if ((long)sVar3 == -1) {
            uVar35 = (ulong)(uint)pbVar13->n_ciphone;
            if (pbVar13->n_ciphone < 1) {
              uVar35 = 0;
            }
            for (lVar54 = 0; uVar35 * 0xc - lVar54 != 0; lVar54 = lVar54 + 0xc) {
              ppVar14 = search[2].last_link;
              if (*(int *)((long)&ppVar14->from + lVar54) < *(int *)(lVar56 + 0x10)) {
                *(int *)((long)&ppVar14->from + lVar54) = *(int *)(lVar56 + 0x10);
                *(int *)((long)&ppVar14->from + lVar54 + 4) = (int)lVar36;
                *(int *)((long)&ppVar14->to + lVar54) = (int)*(short *)(lVar56 + 0x20);
              }
            }
          }
          else {
            sVar4 = *(short *)(lVar56 + 0x20);
            pxVar50 = ((dict2pid_t *)ppStack_458)->rssid[(int)sVar4];
            iVar46 = *(int *)(lVar56 + 0x14);
            lVar56 = *(long *)&search[2].finish_wid;
            uVar35 = (ulong)(uint)pbVar13->n_ciphone;
            if (pbVar13->n_ciphone < 1) {
              uVar35 = 0;
            }
            lVar54 = 8;
            for (uVar57 = 0; uVar35 != uVar57; uVar57 = uVar57 + 1) {
              iVar37 = *(int *)((long)iVar46 * 4 + lVar56 + (long)pxVar50[sVar3].cimap[uVar57] * 4);
              ppVar14 = search[2].last_link;
              if (*(int *)((long)ppVar14 + lVar54 + -8) < iVar37) {
                *(int *)((long)ppVar14 + lVar54 + -8) = iVar37;
                *(int *)((long)ppVar14 + lVar54 + -4) = (int)lVar36;
                *(int *)((long)&ppVar14->from + lVar54) = (int)sVar4;
              }
              lVar54 = lVar54 + 0xc;
            }
          }
        }
      }
      iVar46 = *(int *)((long)&search[1].d2p + 4);
      phVar53 = (hmm_t *)search[1].dict;
      uStack_46c = (uint)puStack_480;
      ppStack_460 = ppVar33;
      if (iVar17 != 0) {
        iVar17 = (uint)puStack_480 + 1;
        iVar37 = search[5].start_wid + *(int *)&search[3].last_link;
        for (; 0 < iVar46; iVar46 = iVar46 + -1) {
          lVar36 = (long)(short)phVar53[1].score[2];
          if (ppVar33 == (ps_search_t *)0x0) {
            iVar45 = 0;
          }
          else {
            iVar45 = *(int *)((long)&(ppVar33[1].acmod)->config + lVar36 * 4);
          }
          ppVar14 = search[2].last_link;
          lVar36 = lVar36 * 0xc;
          iVar55 = *(int *)&search[6].pls + *(int *)((long)&ppVar14->from + lVar36) +
                   *(int *)((long)&search[6].pls + 4);
          if ((iVar37 < iVar45 + iVar55) &&
             ((phVar53->frame < (int)(uint)puStack_480 || (phVar53->score[0] < iVar55)))) {
            hmm_enter(phVar53,iVar55,*(int32 *)((long)&ppVar14->from + lVar36 + 4),iVar17);
            sVar5 = (*(s3ssid_t ***)
                      ((long)ppStack_458->reinit + (long)(short)phVar53[1].score[2] * 8))
                    [*(short *)((long)phVar53[1].score + 10)][*(int *)((long)&ppVar14->to + lVar36)]
            ;
            phVar53->senid[0] = sVar5;
            ppVar33 = ppStack_460;
            if (sVar5 == 0xffff) {
              __assert_fail("hmm_mpx_ssid(&rhmm->hmm, 0) != BAD_SSID",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                            ,0x52e,"void word_transition(ngram_search_t *, int)");
            }
          }
          phVar53 = (hmm_t *)(phVar53[1].score + 4);
        }
        uVar27 = *(uint *)((long)&search[2].vt + 4);
        uVar35 = 0;
        uVar57 = 0;
        if (0 < (int)uVar27) {
          uVar57 = (ulong)uVar27;
        }
        for (; uVar57 != uVar35; uVar35 = uVar35 + 1) {
          *(undefined4 *)
           (&(search[2].d2p)->field_0x4 +
           (long)*(int *)(*(long *)&search[1].finish_wid + uVar35 * 4) * 0xc) = 0x80000000;
        }
        lVar36 = (long)*(int *)(search[3].name + (long)(int)(uint)puStack_480 * 4);
        while (lVar36 < search[2].start_wid) {
          uStack_468 = lVar36;
          if (*(char *)(*(long *)&search[2].post + 4 + lVar36 * 0x24) != '\0') {
            pbVar39 = (bptbl_t *)(*(long *)&search[2].post + lVar36 * 0x24);
            for (lVar36 = 0; lVar36 < (int)uVar27; lVar36 = lVar36 + 1) {
              lVar56 = (long)*(int *)(*(long *)&search[1].finish_wid + lVar36 * 4);
              iVar18 = ngram_search_exit_score
                                 ((ngram_search_t *)search,pbVar39,
                                  (int)*pdVar21->word[lVar56].ciphone);
              iVar46 = -0x20000000;
              if (iVar18 != -0x20000000) {
                iVar20 = ngram_tg_score((ngram_model_t *)search[1].vt,pdVar21->word[lVar56].basewid,
                                        pbVar39->real_wid,pbVar39->prev_real_wid,aiStack_438);
                iVar46 = (iVar20 >> 10) + iVar18;
              }
              pdVar30 = search[2].d2p;
              lVar56 = lVar56 * 0xc;
              if (*(int *)(&pdVar30->field_0x4 + lVar56) < iVar46) {
                *(int *)(&pdVar30->field_0x4 + lVar56) = iVar46;
                *(int *)((long)&pdVar30->mdef + lVar56) = (int)uStack_468;
              }
              uVar27 = *(uint *)((long)&search[2].vt + 4);
            }
          }
          lVar36 = uStack_468 + 1;
        }
        for (lVar36 = 0; lVar36 < (int)uVar27; lVar36 = lVar36 + 1) {
          iVar46 = *(int *)(*(long *)&search[1].finish_wid + lVar36 * 4);
          if (iVar46 != search->dict->startwid) {
            phVar53 = (hmm_t *)(&(search[1].last_link)->from)[iVar46];
            if (ppStack_460 == (ps_search_t *)0x0) {
              iVar45 = 0;
            }
            else {
              iVar45 = *(int *)((long)&(ppStack_460[1].acmod)->config +
                               (long)(short)phVar53[1].score[2] * 4);
            }
            lVar56 = (long)iVar46 * 0xc;
            iVar46 = *(int *)((long)&search[6].pls + 4) +
                     *(int *)(&(search[2].d2p)->field_0x4 + lVar56);
            if (iVar37 < iVar45 + iVar46) {
              lVar54 = *(long *)&search[2].post;
              iVar45 = *(int *)((long)&(search[2].d2p)->mdef + lVar56);
              if ((phVar53->frame < (int)(uint)puStack_480) || (phVar53->score[0] < iVar46)) {
                hmm_enter(phVar53,iVar46,iVar45,iVar17);
                iVar46 = *(int *)(lVar54 + 8 + (long)iVar45 * 0x24);
                uVar2 = (*(s3ssid_t ***)
                          ((long)ppStack_458->reinit + (long)(short)phVar53[1].score[2] * 8))
                        [*(short *)((long)phVar53[1].score + 10)]
                        [pdVar21->word[iVar46].ciphone[(long)pdVar21->word[iVar46].pronlen + -1]];
                phVar53->senid[0] = uVar2;
                if (uVar2 == 0xffff) {
                  __assert_fail("hmm_mpx_ssid(&rhmm->hmm, 0) != BAD_SSID",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                ,0x56c,"void word_transition(ngram_search_t *, int)");
                }
                uVar27 = *(uint *)((long)&search[2].vt + 4);
              }
            }
          }
        }
        lVar36 = (long)search->acmod->mdef->sil * 0xc;
        iVar46 = *(int *)&search[6].name + *(int *)((long)&(search[2].last_link)->from + lVar36) +
                 *(int *)((long)&search[6].pls + 4);
        phVar53 = (hmm_t *)(&(search[1].last_link)->from)[search->silence_wid];
        if (ppStack_460 == (ps_search_t *)0x0) {
          iVar45 = 0;
        }
        else {
          iVar45 = *(int *)((long)&(ppStack_460[1].acmod)->config +
                           (long)(short)phVar53[1].score[2] * 4);
        }
        piVar49 = (int *)((long)&(search[2].last_link)->from + lVar36);
        if ((iVar37 < iVar45 + iVar46) &&
           ((phVar53->frame < (int)(uint)puStack_480 || (phVar53->score[0] < iVar46)))) {
          hmm_enter(phVar53,iVar46,piVar49[1],iVar17);
        }
        ppVar33 = ppStack_460;
        for (lVar36 = (long)pdVar21->filler_start; lVar36 <= pdVar21->filler_end;
            lVar36 = lVar36 + 1) {
          if ((((int)lVar36 != search->silence_wid) && ((int)lVar36 != search->dict->startwid)) &&
             (phVar53 = (hmm_t *)(&(search[1].last_link)->from)[lVar36], phVar53 != (hmm_t *)0x0)) {
            if (ppVar33 == (ps_search_t *)0x0) {
              iVar46 = 0;
            }
            else {
              iVar46 = *(int *)((long)&(ppVar33[1].acmod)->config +
                               (long)(short)phVar53[1].score[2] * 4);
            }
            iVar45 = *(int *)((long)&search[6].type + 4) + *piVar49 +
                     *(int *)((long)&search[6].pls + 4);
            if ((iVar37 < iVar46 + iVar45) &&
               ((phVar53->frame < (int)(uint)puStack_480 || (phVar53->score[0] < iVar45)))) {
              hmm_enter(phVar53,iVar45,piVar49[1],iVar17);
              ppVar33 = ppStack_460;
            }
          }
        }
        iVar46 = *(int *)((long)&search[1].d2p + 4);
        phVar53 = (hmm_t *)search[1].dict;
        puStack_480._0_4_ = uStack_46c;
      }
      for (; 0 < iVar46; iVar46 = iVar46 + -1) {
        if (phVar53->frame == (uint)puStack_480) {
          hmm_clear(phVar53);
        }
        phVar53 = (hmm_t *)(phVar53[1].score + 4);
      }
      for (lVar36 = 0; lVar36 < *(int *)&search[2].vt; lVar36 = lVar36 + 1) {
        phVar53 = (hmm_t *)(&(search[1].last_link)->from)
                           [*(int *)(*(long *)&search[1].finish_wid + lVar36 * 4)];
        if (phVar53->frame == (uint)puStack_480) {
          hmm_clear(phVar53);
        }
      }
      piVar49 = (int *)((long)&search[3].type + 4);
      *piVar49 = *piVar49 + 1;
      iVar17 = 1;
    }
  }
  return iVar17;
}

Assistant:

static int
ngram_search_step(ps_search_t *search, int frame_idx)
{
    ngram_search_t *ngs = (ngram_search_t *)search;

    if (ngs->fwdtree)
        return ngram_fwdtree_search(ngs, frame_idx);
    else if (ngs->fwdflat)
        return ngram_fwdflat_search(ngs, frame_idx);
    else
        return -1;
}